

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_getfenv(lua_State *L)

{
  uint uVar1;
  int32_t level;
  cTValue *pcVar2;
  cTValue *pcVar3;
  GCRef *pGVar4;
  int local_c;
  
  pcVar2 = L->base;
  pcVar3 = L->top;
  if ((pcVar3 <= pcVar2) || ((pcVar2->field_2).it != 0xfffffff7)) {
    level = lj_lib_optint(L,1,1);
    pcVar2 = lj_debug_frame(L,level,&local_c);
    if (pcVar2 == (cTValue *)0x0) {
      lj_err_arg(L,1,LJ_ERR_INVLVL);
    }
    pcVar3 = L->top;
  }
  uVar1 = (pcVar2->u32).lo;
  L->top = pcVar3 + 1;
  pGVar4 = &L->env;
  if (*(char *)((ulong)uVar1 + 6) == '\0') {
    pGVar4 = (GCRef *)((ulong)uVar1 + 8);
  }
  (pcVar3->field_2).field_0 =
       (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)pGVar4->gcptr32;
  (pcVar3->field_2).it = 0xfffffff4;
  return 1;
}

Assistant:

LJLIB_CF(getfenv)
{
  GCfunc *fn;
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_optint(L, 1, 1);
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
  }
  fn = &gcval(o)->fn;
  settabV(L, L->top++, isluafunc(fn) ? tabref(fn->l.env) : tabref(L->env));
  return 1;
}